

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O3

void __thiscall
Catch::XmlReporter::EndTestCase
          (XmlReporter *this,TestCaseInfo *param_1,Totals *param_2,string *param_3,string *param_4)

{
  XmlWriter *this_00;
  ScopedElement scoped;
  ScopedElement local_68;
  string local_60;
  string local_40;
  
  this_00 = &this->m_xml;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"OverallResult","");
  local_68.m_writer = this_00;
  XmlWriter::startElement(this_00,&local_40);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"success","");
  XmlWriter::writeAttribute(local_68.m_writer,&local_60,this->m_currentTestSuccess);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  XmlWriter::endElement(this_00);
  return;
}

Assistant:

virtual void EndTestCase( const Catch::TestCaseInfo&, const Totals&, const std::string&, const std::string& ) {
            m_xml.scopedElement( "OverallResult" ).writeAttribute( "success", m_currentTestSuccess );
            m_xml.endElement();
        }